

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O3

void __thiscall
duckdb::
MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
::BuildRun(MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
           *this,idx_t level_idx,idx_t run_idx)

{
  ulong uVar1;
  value_type vVar2;
  unsigned_long uVar3;
  MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
  *this_00;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  const_reference pvVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  size_type __n;
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *__s;
  long lVar13;
  ulong *puVar14;
  size_type sVar15;
  ulong uVar16;
  RunElement *insert_val;
  ulong uVar17;
  size_type sVar18;
  unsigned_long uVar19;
  size_type sVar20;
  array<std::pair<unsigned_long,_unsigned_long>,_32UL> bounds;
  Games games;
  RunElements players;
  RunElement local_8b8;
  size_type local_8a0;
  MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
  *local_898;
  ulong local_890;
  ulong local_888;
  reference local_880;
  RunElement local_878;
  ulong local_860;
  reference local_858;
  RunElement local_850;
  RunElement local_838;
  value_type local_818;
  ulong local_810 [63];
  Games local_618;
  RunElements local_330;
  
  local_898 = this;
  pvVar5 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
           ::operator[](&this->tree,level_idx);
  pvVar6 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
           ::operator[](&this->tree,level_idx);
  __n = level_idx - 1;
  local_880 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
              ::operator[](&this->tree,__n);
  if (level_idx < 2) {
    local_890 = 1;
    uVar17 = 0x20;
  }
  else {
    uVar17 = 0x20;
    do {
      local_890 = uVar17;
      uVar17 = local_890 << 5;
      __n = __n - 1;
    } while (__n != 0);
  }
  local_888 = (long)(pvVar5->first).
                    super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                    .
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar5->first).
                    super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                    .
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl.
  _0_4_ = 0xffffffff;
  local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl.
  _4_4_ = 0xffffffff;
  local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._0_4_ = 0xffffffff;
  local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_ = 0xffffffff;
  local_8b8.second = 0xffffffffffffffff;
  uVar19 = 0;
  local_858 = pvVar5;
  switchD_01043a80::default(&local_818,0,0x200);
  __s = local_330._M_elems;
  switchD_01043a80::default(__s,0,0x300);
  local_8a0 = uVar17 * run_idx;
  puVar14 = local_810;
  uVar11 = local_888;
  sVar20 = local_8a0;
  uVar16 = local_890;
  local_860 = uVar17;
  do {
    uVar17 = uVar11;
    if (sVar20 < uVar11) {
      uVar17 = sVar20;
    }
    uVar1 = uVar16 + sVar20;
    uVar10 = uVar11;
    if (uVar1 < uVar11) {
      uVar10 = uVar1;
    }
    puVar14[-1] = uVar17;
    *puVar14 = uVar10;
    if (uVar17 == uVar10) {
      *(undefined4 *)
       &(((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
        super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
        super__Head_base<1UL,_unsigned_long,_false>._M_head_impl = 0xffffffff;
      *(undefined4 *)
       ((long)&(((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->
               first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
               super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
               _M_head_impl + 4) = 0xffffffff;
      *(undefined4 *)
       &(((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
        super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0xffffffff;
      *(undefined4 *)
       ((long)&(((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->
               first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + 4) = 0xffffffff;
      __s->second = 0xffffffffffffffff;
    }
    else {
      pvVar9 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                         (&local_880->first,sVar20);
      uVar3 = (pvVar9->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
           (pvVar9->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
           super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
           _M_head_impl;
      (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar3;
      __s->second = uVar19;
      uVar11 = local_888;
      uVar16 = local_890;
    }
    uVar19 = uVar19 + 1;
    __s = __s + 1;
    puVar14 = puVar14 + 2;
    sVar20 = uVar1;
  } while (uVar19 != 0x20);
  switchD_01043a80::default(&local_618,0,0x2e8);
  this_00 = local_898;
  sVar18 = run_idx * ((local_860 >> 5) + 2) * 0x20;
  StartGames(&local_878,local_898,&local_618,&local_330,&local_8b8);
  sVar20 = local_8a0;
  if (((local_878.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl !=
        CONCAT44(local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                 super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_,
                 (undefined4)
                 local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                 super__Head_base<0UL,_unsigned_long,_false>._M_head_impl)) ||
      (local_878.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
       super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
       _M_head_impl !=
       (_Head_base<1UL,_unsigned_long,_false>)
       CONCAT44(local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
                _M_head_impl._4_4_,
                (undefined4)
                local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
                _M_head_impl))) || (local_878.second != local_8b8.second)) {
    do {
      if (((pvVar6->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (pvVar6->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish) && ((sVar20 & 0x1f) == 0)) {
        lVar13 = 0;
        sVar15 = sVar18;
        do {
          vVar2 = *(value_type *)((long)local_810 + lVar13 + -8);
          sVar18 = sVar15 + 1;
          pvVar7 = vector<unsigned_long,_true>::operator[](&pvVar6->second,sVar15);
          *pvVar7 = vVar2;
          lVar13 = lVar13 + 0x10;
          sVar15 = sVar18;
        } while (lVar13 != 0x200);
      }
      pvVar8 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                         (&local_858->first,sVar20);
      uVar19 = local_878.second;
      (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = (unsigned_long)
             local_878.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl;
      (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           local_878.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
           super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      uVar17 = local_810[local_878.second * 2 + -1] + 1;
      local_810[local_878.second * 2 + -1] = uVar17;
      if (uVar17 < local_810[local_878.second * 2]) {
        pvVar9 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                           (&local_880->first,uVar17);
        local_838.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
        super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
        _M_head_impl = (_Head_base<1UL,_unsigned_long,_false>)
                       (pvVar9->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
                       super__Tuple_impl<1UL,_unsigned_long>.
                       super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
        local_838.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
             (pvVar9->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
             super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        insert_val = &local_838;
        local_838.second = uVar19;
      }
      else {
        insert_val = &local_8b8;
      }
      ReplayGames(&local_850,this_00,&local_618,uVar19,insert_val);
      local_878.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = local_850.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl;
      local_878.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           local_850.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
           super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      local_878.second = local_850.second;
      sVar20 = sVar20 + 1;
    } while (((local_850.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl !=
               CONCAT44(local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_,
                        (undefined4)
                        local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl)) ||
             (local_850.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
              super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
              _M_head_impl !=
              (_Head_base<1UL,_unsigned_long,_false>)
              CONCAT44(local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                       super__Tuple_impl<1UL,_unsigned_long>.
                       super__Head_base<1UL,_unsigned_long,_false>._M_head_impl._4_4_,
                       (undefined4)
                       local_8b8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                       super__Tuple_impl<1UL,_unsigned_long>.
                       super__Head_base<1UL,_unsigned_long,_false>._M_head_impl))) ||
            (local_850.second != local_8b8.second));
  }
  if ((pvVar6->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pvVar6->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = true;
    do {
      bVar12 = bVar4;
      lVar13 = 0;
      sVar15 = sVar18;
      do {
        vVar2 = *(value_type *)((long)local_810 + lVar13 + -8);
        sVar18 = sVar15 + 1;
        pvVar7 = vector<unsigned_long,_true>::operator[](&pvVar6->second,sVar15);
        *pvVar7 = vVar2;
        lVar13 = lVar13 + 0x10;
        sVar15 = sVar18;
      } while (lVar13 != 0x200);
      bVar4 = false;
    } while (bVar12);
  }
  LOCK();
  (local_898->build_complete).super___atomic_base<unsigned_long>._M_i =
       (local_898->build_complete).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void MergeSortTree<E, O, CMP, F, C>::BuildRun(idx_t level_idx, idx_t run_idx) {
	//	Create each parent run by merging the child runs using a tournament tree
	// 	https://en.wikipedia.org/wiki/K-way_merge_algorithm
	const auto fanout = F;
	const auto cascading = C;

	auto &elements = tree[level_idx].first;
	auto &cascades = tree[level_idx].second;
	const auto &child_level = tree[level_idx - 1];
	const auto count = elements.size();

	idx_t child_run_length = 1;
	auto run_length = child_run_length * fanout;
	for (idx_t l = 1; l < level_idx; ++l) {
		child_run_length = run_length;
		run_length *= fanout;
	}

	const RunElement SENTINEL(MergeSortTraits<ElementType>::SENTINEL(), MergeSortTraits<idx_t>::SENTINEL());

	//	Position markers for scanning the children.
	using Bounds = pair<OffsetType, OffsetType>;
	array<Bounds, fanout> bounds;
	//	Start with first element of each (sorted) child run
	RunElements players;
	const auto child_base = run_idx * run_length;
	for (idx_t child_run = 0; child_run < fanout; ++child_run) {
		const auto child_idx = child_base + child_run * child_run_length;
		bounds[child_run] = {OffsetType(MinValue<idx_t>(child_idx, count)),
		                     OffsetType(MinValue<idx_t>(child_idx + child_run_length, count))};
		if (bounds[child_run].first != bounds[child_run].second) {
			players[child_run] = {child_level.first[child_idx], child_run};
		} else {
			//	Empty child
			players[child_run] = SENTINEL;
		}
	}

	//	Play the first round and extract the winner
	Games games;
	auto element_idx = child_base;
	auto cascade_idx = fanout * run_idx * (run_length / cascading + 2);
	auto winner = StartGames(games, players, SENTINEL);
	while (winner != SENTINEL) {
		// Add fractional cascading pointers
		// if we are on a fraction boundary
		if (!cascades.empty() && element_idx % cascading == 0) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}

		//	Insert new winner element into the current run
		elements[element_idx++] = winner.first;
		const auto child_run = winner.second;
		auto &child_idx = bounds[child_run].first;
		++child_idx;

		//	Move to the next entry in the child run (if any)
		if (child_idx < bounds[child_run].second) {
			winner = ReplayGames(games, child_run, {child_level.first[child_idx], child_run});
		} else {
			winner = ReplayGames(games, child_run, SENTINEL);
		}
	}

	// Add terminal cascade pointers to the end
	if (!cascades.empty()) {
		for (idx_t j = 0; j < 2; ++j) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}
	}

	++build_complete;
}